

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalArray_const<int>::SignalArray_const
          (SignalArray_const<int> *this,SignalBase<int> *sig)

{
  allocator_type local_19;
  
  this->_vptr_SignalArray_const = (_func_int **)&PTR__SignalArray_const_0012c420;
  std::
  vector<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::vector(&this->const_array,0x14,&local_19);
  this->size = 0x14;
  this->rank = 0;
  addElmt(this,sig);
  return;
}

Assistant:

SignalArray_const<Time>(const SignalBase<Time> &sig)
      : const_array(DEFAULT_SIZE), size(DEFAULT_SIZE), rank(0) {
    addElmt(&sig);
  }